

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckArrayClose<float[4],float_const*,float>
               (TestResults *results,float (*expected) [4],float **actual,int count,float *tolerance
               ,TestDetails *details)

{
  bool bVar1;
  ostream *poVar2;
  char *failure;
  ulong uVar3;
  int actualIndex;
  ulong uVar4;
  MemoryOutStream stream;
  MemoryOutStream local_1c8;
  
  bVar1 = ArrayAreClose<float[4],float_const*,float>(expected,actual,count,tolerance);
  if (!bVar1) {
    MemoryOutStream::MemoryOutStream(&local_1c8);
    std::operator<<((ostream *)&local_1c8,"Expected [ ");
    uVar3 = 0;
    uVar4 = (ulong)(uint)count;
    if (count < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(&local_1c8,(*expected)[uVar3]);
      std::operator<<(poVar2," ");
    }
    poVar2 = std::operator<<((ostream *)&local_1c8,"] +/- ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*tolerance);
    std::operator<<(poVar2," but was [ ");
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(&local_1c8,(*actual)[uVar3]);
      std::operator<<(poVar2," ");
    }
    std::operator<<((ostream *)&local_1c8,"]");
    failure = MemoryOutStream::GetText(&local_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c8);
  }
  return;
}

Assistant:

void CheckArrayClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const count, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = ArrayAreClose(expected, actual, count, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";
        for (int expectedIndex = 0; expectedIndex < count; ++expectedIndex)
            stream << expected[expectedIndex] << " ";
        stream << "] +/- " << tolerance << " but was [ ";

		for (int actualIndex = 0; actualIndex < count; ++actualIndex)
            stream << actual[actualIndex] << " ";
        stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}